

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::MarbleTexture::Evaluate(MarbleTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  TextureEvalContext ctx_00;
  array<float,_4> aVar3;
  int *piVar4;
  RGB *in_RDI;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar21 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar22 [64];
  undefined1 auVar25 [12];
  undefined1 auVar24 [16];
  Point3f PVar26;
  Vector3<float> VVar27;
  RGB RVar28;
  SampledSpectrum SVar29;
  undefined1 in_stack_00000008 [64];
  RGB s2;
  RGB s1;
  RGB s0;
  int first;
  int nSeg;
  RGB c [9];
  Float t;
  Float marble;
  Point3f p;
  Vector3f dpdy;
  Vector3f dpdx;
  undefined1 auVar30 [24];
  RGB *s1_00;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  Float t_00;
  undefined4 in_stack_fffffffffffffd78;
  Float in_stack_fffffffffffffd7c;
  Float FVar31;
  undefined4 in_stack_fffffffffffffd80;
  Float r;
  undefined4 in_stack_fffffffffffffd84;
  Float b;
  Vector3f *in_stack_fffffffffffffd88;
  Point3f *in_stack_fffffffffffffd90;
  undefined1 *puVar32;
  undefined1 in_stack_fffffffffffffda8 [32];
  undefined8 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined8 in_stack_fffffffffffffdd8;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  RGB local_148;
  RGB local_13c;
  RGB local_130;
  RGB local_124;
  RGB local_118;
  RGB local_10c;
  RGB local_100;
  RGB local_f4;
  RGB local_e8;
  float local_dc;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  uint local_9c;
  RGB local_98;
  undefined1 local_88 [64];
  RGB local_40 [5];
  undefined1 auVar20 [12];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar23 [56];
  
  puVar32 = &stack0x00000048;
  Vector3<float>::Vector3((Vector3<float> *)0x6df10b);
  Vector3<float>::Vector3((Vector3<float> *)0x6df11d);
  auVar5 = vmovdqu64_avx512f(in_stack_00000008);
  local_88 = vmovdqu64_avx512f(auVar5);
  auVar6 = vmovdqu64_avx512f(local_88);
  auVar5 = vmovdqu64_avx512f(auVar6);
  auVar30 = auVar5._32_24_;
  auVar21 = ZEXT856(auVar6._8_8_);
  auVar20 = in_stack_fffffffffffffda8._4_12_;
  auVar25 = in_stack_fffffffffffffda8._16_12_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)in_stack_fffffffffffffda8._0_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar20._0_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar20._4_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar20._8_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar25._0_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar25._4_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar25._8_4_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffffda8._28_4_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = puVar32;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffdc8;
  ctx_00.dudx = (Float)(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  ctx_00.dudy = (Float)in_stack_fffffffffffffdd0;
  ctx_00.dvdx = (Float)in_stack_fffffffffffffdd4;
  ctx_00.dvdy = (Float)(int)in_stack_fffffffffffffdd8;
  ctx_00.faceIndex = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  PVar26 = TextureMapping3DHandle::Map
                     ((TextureMapping3DHandle *)
                      CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),ctx_00,
                      (Vector3f *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                      (Vector3f *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  local_98.b = PVar26.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar26.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar21;
  local_98._0_8_ = vmovlpd_avx(auVar5._0_16_);
  s1_00 = local_40;
  local_40[0]._0_8_ = local_98._0_8_;
  local_40[0].b = local_98.b;
  Tuple3<pbrt::Point3,float>::operator*=((Tuple3<pbrt::Point3,float> *)s1_00,in_RDI[1].g);
  auVar21 = (undefined1  [56])0x0;
  FVar31 = in_RDI[1].b;
  t_00 = local_40[0].g;
  VVar27 = pbrt::operator*(auVar30._12_4_,auVar30._0_8_);
  local_b0 = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar21;
  local_b8 = vmovlpd_avx(auVar6._0_16_);
  auVar21 = (undefined1  [56])0x0;
  local_a8 = local_b8;
  local_a0 = local_b0;
  VVar27 = pbrt::operator*(auVar30._12_4_,auVar30._0_8_);
  local_d0 = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar21;
  local_d8 = vmovlpd_avx(auVar8._0_16_);
  local_c8 = local_d8;
  local_c0 = local_d0;
  auVar9._0_4_ = FBm(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                     (Vector3f *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd7c,(int)FVar31);
  auVar9._4_60_ = extraout_var;
  auVar7 = vfmadd213ss_fma(auVar9._0_16_,ZEXT416((uint)FVar31),ZEXT416((uint)t_00));
  local_9c = auVar7._0_4_;
  auVar10._0_8_ = std::sin((double)(ulong)local_9c);
  auVar10._8_56_ = extraout_var_00;
  FVar31 = 0.5;
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),auVar10._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  local_dc = auVar7._0_4_;
  r = 0.58;
  b = 0.6;
  RGB::RGB(&local_148,0.58,0.58,0.6);
  RGB::RGB(&local_13c,r,r,b);
  RGB::RGB(&local_130,r,r,b);
  RGB::RGB(&local_124,FVar31,FVar31,FVar31);
  RGB::RGB(&local_118,b,0.59,r);
  RGB::RGB(&local_10c,r,r,b);
  RGB::RGB(&local_100,r,r,b);
  RGB::RGB(&local_f4,0.2,0.2,0.33);
  auVar25 = (undefined1  [12])0x0;
  RGB::RGB(&local_e8,r,r,b);
  local_14c = 6;
  auVar11._0_8_ = std::floor((double)(ulong)(uint)(local_dc * 6.0));
  auVar11._8_56_ = extraout_var_01;
  auVar20 = auVar11._4_12_;
  local_154 = (int)SUB84(auVar11._0_8_,0);
  local_158 = local_14c + -1;
  piVar4 = std::min<int>(&local_154,&local_158);
  local_150 = *piVar4;
  auVar23 = SUB6056((undefined1  [60])0x0,4);
  auVar7._0_4_ = (float)local_14c;
  auVar7._4_12_ = auVar20;
  auVar24._0_4_ = (float)local_150;
  auVar24._4_12_ = auVar25;
  auVar7 = vfmsub213ss_fma(auVar7,ZEXT416((uint)local_dc),auVar24);
  local_dc = auVar7._0_4_;
  auVar21 = (undefined1  [56])0x0;
  RVar28 = Lerp(t_00,s1_00,in_RDI);
  auVar12._0_8_ = RVar28._0_8_;
  auVar12._8_56_ = auVar21;
  vmovlpd_avx(auVar12._0_16_);
  auVar21 = (undefined1  [56])0x0;
  RVar28 = Lerp(t_00,s1_00,in_RDI);
  auVar13._0_8_ = RVar28._0_8_;
  auVar13._8_56_ = auVar21;
  vmovlpd_avx(auVar13._0_16_);
  auVar21 = (undefined1  [56])0x0;
  RVar28 = Lerp(t_00,s1_00,in_RDI);
  auVar14._0_8_ = RVar28._0_8_;
  auVar14._8_56_ = auVar21;
  vmovlpd_avx(auVar14._0_16_);
  auVar21 = (undefined1  [56])0x0;
  RVar28 = Lerp(t_00,s1_00,in_RDI);
  auVar15._0_8_ = RVar28._0_8_;
  auVar15._8_56_ = auVar21;
  vmovlpd_avx(auVar15._0_16_);
  auVar21 = (undefined1  [56])0x0;
  RVar28 = Lerp(t_00,s1_00,in_RDI);
  auVar16._0_8_ = RVar28._0_8_;
  auVar16._8_56_ = auVar21;
  vmovlpd_avx(auVar16._0_16_);
  auVar21 = (undefined1  [56])0x0;
  RVar28 = Lerp(t_00,s1_00,in_RDI);
  auVar17._0_8_ = RVar28._0_8_;
  auVar17._8_56_ = auVar21;
  vmovlpd_avx(auVar17._0_16_);
  auVar21 = (undefined1  [56])0x0;
  RVar28 = pbrt::operator*(auVar30._12_4_,auVar30._0_8_);
  auVar7 = auVar30._8_16_;
  auVar18._0_8_ = RVar28._0_8_;
  auVar18._8_56_ = auVar21;
  vmovlpd_avx(auVar18._0_16_);
  RGBReflectanceSpectrum::RGBReflectanceSpectrum(auVar30._16_8_,auVar30._8_8_,auVar30._0_8_);
  SVar29 = RGBReflectanceSpectrum::Sample(auVar7._8_8_,auVar7._0_8_);
  auVar22._0_8_ = SVar29.values.values._8_8_;
  auVar22._8_56_ = auVar23;
  auVar19._0_8_ = SVar29.values.values._0_8_;
  auVar19._8_56_ = auVar21;
  uVar1 = vmovlpd_avx(auVar19._0_16_);
  uVar2 = vmovlpd_avx(auVar22._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum MarbleTexture::Evaluate(TextureEvalContext ctx,
                                        SampledWavelengths lambda) const {
    Vector3f dpdx, dpdy;
    Point3f p = mapping.Map(ctx, &dpdx, &dpdy);
    p *= scale;
    Float marble = p.y + variation * FBm(p, scale * dpdx, scale * dpdy, omega, octaves);
    Float t = .5f + .5f * std::sin(marble);
    // Evaluate marble spline at _t_
    const RGB c[] = {
        {.58f, .58f, .6f}, {.58f, .58f, .6f}, {.58f, .58f, .6f},
        {.5f, .5f, .5f},   {.6f, .59f, .58f}, {.58f, .58f, .6f},
        {.58f, .58f, .6f}, {.2f, .2f, .33f},  {.58f, .58f, .6f},
    };
    int nSeg = PBRT_ARRAYSIZE(c) - 3;
    int first = std::min<int>(std::floor(t * nSeg), nSeg - 1);
    t = (t * nSeg - first);
    // Bezier spline evaluated with de Castilejau's algorithm
    RGB s0 = Lerp(t, c[first], c[first + 1]);
    RGB s1 = Lerp(t, c[first + 1], c[first + 2]);
    RGB s2 = Lerp(t, c[first + 2], c[first + 3]);
    s0 = Lerp(t, s0, s1);
    s1 = Lerp(t, s1, s2);
    // Extra scale of 1.5 to increase variation among colors
    s0 = 1.5f * Lerp(t, s0, s1);
#ifdef PBRT_IS_GPU_CODE
    return RGBReflectanceSpectrum(*RGBColorSpace_sRGB, s0).Sample(lambda);
#else
    return RGBReflectanceSpectrum(*RGBColorSpace::sRGB, s0).Sample(lambda);
#endif
}